

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O0

void dctInverse8x8_scalar(float *data,int zeroedRows)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int column;
  int row;
  float *rowPtr;
  float gamma [4];
  float theta [4];
  float beta [4];
  float alpha [4];
  float g;
  float f;
  float e;
  float d;
  float c;
  float b;
  float a;
  int zeroedRows_local;
  float *data_local;
  
  for (row = 0; row < 8 - zeroedRows; row = row + 1) {
    pfVar1 = data + (row << 3);
    fVar2 = pfVar1[7] * 0.09754573 +
            pfVar1[5] * 0.27778545 + pfVar1[1] * 0.49039266 + pfVar1[3] * 0.41573495;
    fVar3 = pfVar1[7] * -0.27778545 +
            pfVar1[5] * -0.49039266 + pfVar1[1] * 0.41573495 + -(pfVar1[3] * 0.09754573);
    fVar4 = pfVar1[7] * 0.41573495 +
            pfVar1[5] * 0.09754573 + pfVar1[1] * 0.27778545 + -(pfVar1[3] * 0.49039266);
    fVar5 = pfVar1[7] * -0.49039266 +
            pfVar1[5] * 0.41573495 + pfVar1[1] * 0.09754573 + -(pfVar1[3] * 0.27778545);
    fVar6 = (*pfVar1 + pfVar1[4]) * 0.35355362;
    fVar7 = (*pfVar1 - pfVar1[4]) * 0.35355362;
    fVar8 = pfVar1[2] * 0.46193984 + pfVar1[6] * 0.19134218;
    fVar9 = pfVar1[2] * 0.19134218 - pfVar1[6] * 0.46193984;
    fVar10 = fVar6 + fVar8;
    fVar11 = fVar7 + fVar9;
    fVar7 = fVar7 - fVar9;
    fVar6 = fVar6 - fVar8;
    *pfVar1 = fVar10 + fVar2;
    pfVar1[1] = fVar11 + fVar3;
    pfVar1[2] = fVar7 + fVar4;
    pfVar1[3] = fVar6 + fVar5;
    pfVar1[4] = fVar6 - fVar5;
    pfVar1[5] = fVar7 - fVar4;
    pfVar1[6] = fVar11 - fVar3;
    pfVar1[7] = fVar10 - fVar2;
  }
  for (column = 0; column < 8; column = column + 1) {
    fVar2 = data[column + 0x38] * 0.09754573 +
            data[column + 0x28] * 0.27778545 +
            data[column + 8] * 0.49039266 + data[column + 0x18] * 0.41573495;
    fVar3 = data[column + 0x38] * -0.27778545 +
            data[column + 0x28] * -0.49039266 +
            data[column + 8] * 0.41573495 + -(data[column + 0x18] * 0.09754573);
    fVar4 = data[column + 0x38] * 0.41573495 +
            data[column + 0x28] * 0.09754573 +
            data[column + 8] * 0.27778545 + -(data[column + 0x18] * 0.49039266);
    fVar5 = data[column + 0x38] * -0.49039266 +
            data[column + 0x28] * 0.41573495 +
            data[column + 8] * 0.09754573 + -(data[column + 0x18] * 0.27778545);
    fVar6 = (data[column] + data[column + 0x20]) * 0.35355362;
    fVar7 = (data[column] - data[column + 0x20]) * 0.35355362;
    fVar8 = data[column + 0x10] * 0.46193984 + data[column + 0x30] * 0.19134218;
    fVar9 = data[column + 0x10] * 0.19134218 - data[column + 0x30] * 0.46193984;
    fVar10 = fVar6 + fVar8;
    fVar11 = fVar7 + fVar9;
    fVar7 = fVar7 - fVar9;
    fVar6 = fVar6 - fVar8;
    data[column] = fVar10 + fVar2;
    data[column + 8] = fVar11 + fVar3;
    data[column + 0x10] = fVar7 + fVar4;
    data[column + 0x18] = fVar6 + fVar5;
    data[column + 0x20] = fVar6 - fVar5;
    data[column + 0x28] = fVar7 - fVar4;
    data[column + 0x30] = fVar11 - fVar3;
    data[column + 0x38] = fVar10 - fVar2;
  }
  return;
}

Assistant:

static inline void
dctInverse8x8_scalar (float* data, int zeroedRows)
{
    const float a = 0.35355362513961314f;//.5f * cosf (3.14159f / 4.0f);
    const float b = 0.4903926563794112f;//.5f * cosf (3.14159f / 16.0f);
    const float c = 0.4619398297234211f;//.5f * cosf (3.14159f / 8.0f);
    const float d = 0.4157349443626743f;//.5f * cosf (3.f * 3.14159f / 16.0f);
    const float e = 0.2777854612564676f;//.5f * cosf (5.f * 3.14159f / 16.0f);
    const float f = 0.19134217585694352f;//.5f * cosf (3.f * 3.14159f / 8.0f);
    const float g = 0.09754573032714427f;//.5f * cosf (7.f * 3.14159f / 16.0f);

    float alpha[4], beta[4], theta[4], gamma[4];

    float* rowPtr = NULL;

    //
    // First pass - row wise.
    //
    // This looks less-compact than the description above in
    // an attempt to fold together common sub-expressions.
    //

    for (int row = 0; row < 8 - zeroedRows; ++row)
    {
        rowPtr = data + row * 8;

        alpha[0] = c * rowPtr[2];
        alpha[1] = f * rowPtr[2];
        alpha[2] = c * rowPtr[6];
        alpha[3] = f * rowPtr[6];

        beta[0] = b * rowPtr[1] + d * rowPtr[3] + e * rowPtr[5] + g * rowPtr[7];
        beta[1] = d * rowPtr[1] - g * rowPtr[3] - b * rowPtr[5] - e * rowPtr[7];
        beta[2] = e * rowPtr[1] - b * rowPtr[3] + g * rowPtr[5] + d * rowPtr[7];
        beta[3] = g * rowPtr[1] - e * rowPtr[3] + d * rowPtr[5] - b * rowPtr[7];

        theta[0] = a * (rowPtr[0] + rowPtr[4]);
        theta[3] = a * (rowPtr[0] - rowPtr[4]);

        theta[1] = alpha[0] + alpha[3];
        theta[2] = alpha[1] - alpha[2];

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        rowPtr[0] = gamma[0] + beta[0];
        rowPtr[1] = gamma[1] + beta[1];
        rowPtr[2] = gamma[2] + beta[2];
        rowPtr[3] = gamma[3] + beta[3];

        rowPtr[4] = gamma[3] - beta[3];
        rowPtr[5] = gamma[2] - beta[2];
        rowPtr[6] = gamma[1] - beta[1];
        rowPtr[7] = gamma[0] - beta[0];
    }

    //
    // Second pass - column wise.
    //

    for (int column = 0; column < 8; ++column)
    {
        alpha[0] = c * data[16 + column];
        alpha[1] = f * data[16 + column];
        alpha[2] = c * data[48 + column];
        alpha[3] = f * data[48 + column];

        beta[0] = b * data[8 + column] + d * data[24 + column] +
                  e * data[40 + column] + g * data[56 + column];

        beta[1] = d * data[8 + column] - g * data[24 + column] -
                  b * data[40 + column] - e * data[56 + column];

        beta[2] = e * data[8 + column] - b * data[24 + column] +
                  g * data[40 + column] + d * data[56 + column];

        beta[3] = g * data[8 + column] - e * data[24 + column] +
                  d * data[40 + column] - b * data[56 + column];

        theta[0] = a * (data[column] + data[32 + column]);
        theta[3] = a * (data[column] - data[32 + column]);

        theta[1] = alpha[0] + alpha[3];
        theta[2] = alpha[1] - alpha[2];

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        data[column]      = gamma[0] + beta[0];
        data[8 + column]  = gamma[1] + beta[1];
        data[16 + column] = gamma[2] + beta[2];
        data[24 + column] = gamma[3] + beta[3];

        data[32 + column] = gamma[3] - beta[3];
        data[40 + column] = gamma[2] - beta[2];
        data[48 + column] = gamma[1] - beta[1];
        data[56 + column] = gamma[0] - beta[0];
    }
}